

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

Test * anon_unknown.dwarf_57051::DiskInterfaceTestStatBadPath::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x58);
  DiskInterfaceTestStatBadPath((DiskInterfaceTestStatBadPath *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}